

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorSet::MergeFrom(FileDescriptorSet *this,FileDescriptorSet *from)

{
  void *pvVar1;
  Rep *pRVar2;
  void **our_elems;
  int iVar3;
  
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  iVar3 = (from->file_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    pRVar2 = (from->file_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->file_).super_RepeatedPtrFieldBase,iVar3);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
              (&(this->file_).super_RepeatedPtrFieldBase,our_elems,pRVar2->elements,iVar3,
               ((this->file_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->file_).super_RepeatedPtrFieldBase.current_size_);
    iVar3 = iVar3 + (this->file_).super_RepeatedPtrFieldBase.current_size_;
    (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3;
    pRVar2 = (this->file_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar2->allocated_size < iVar3) {
      pRVar2->allocated_size = iVar3;
    }
  }
  return;
}

Assistant:

void FileDescriptorSet::MergeFrom(const FileDescriptorSet& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorSet)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  file_.MergeFrom(from.file_);
}